

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool anon_unknown.dwarf_2a6a20::ParseKeyPath
               (vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *split,
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *out,bool *apostrophe,string *error,bool allow_multipath)

{
  char *pcVar1;
  Span<const_char> elem;
  _Optional_payload_base<unsigned_int> _Var2;
  pointer pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long unaff_RBP;
  long lVar4;
  undefined7 in_register_00000081;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  _Optional_payload_base<unsigned_int> _Var8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar11;
  string_view separators;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_multipath;
  vector<unsigned_int,_std::allocator<unsigned_int>_> multipath_values;
  KeyPath path;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> nums;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_110;
  uint *local_d8;
  iterator iStack_d0;
  uint *local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  _Storage<unsigned_int,_true> local_a0;
  bool bStack_9c;
  string local_98;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_78;
  char *local_70;
  undefined1 local_68 [16];
  _Storage<unsigned_int,_true> local_58;
  bool bStack_54;
  _Optional_payload_base<unsigned_int> local_50;
  long local_48;
  __node_base_ptr local_38;
  
  pcVar5 = (char *)CONCAT71(in_register_00000081,allow_multipath);
  local_38 = *(__node_base_ptr *)(in_FS_OFFSET + 0x28);
  bVar7 = false;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_c8 = (uint *)0x0;
  local_d8 = (uint *)0x0;
  iStack_d0._M_current = (uint *)0x0;
  local_110._M_buckets = &local_110._M_single_bucket;
  local_110._M_bucket_count = 1;
  local_110._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_110._M_element_count = 0;
  local_110._M_rehash_policy._M_max_load_factor = 1.0;
  local_110._M_rehash_policy._M_next_resize = 0;
  local_110._M_single_bucket = (__node_base_ptr)0x0;
  pSVar3 = (split->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  bVar9 = (ulong)((long)(split->
                        super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) < 0x11;
  if (!bVar9) {
    uVar6 = 1;
    bVar7 = false;
    do {
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pSVar3 + uVar6);
      if (((pSVar3[uVar6].m_size == 0) || (pcVar1 = (args->_M_dataplus)._M_p, *pcVar1 != '<')) ||
         (pcVar1[pSVar3[uVar6].m_size - 1] != '>')) {
        elem.m_data = (args->_M_dataplus)._M_p;
        elem.m_size = args->_M_string_length;
        _local_58 = (_Optional_payload_base<unsigned_int>)ParseKeyPathNum(elem,apostrophe,error);
        if (bStack_54 == false) goto LAB_00165df1;
        if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_58._M_value);
        }
        else {
          *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = (uint)local_58;
          local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        if (!allow_multipath) {
          pcVar5 = (args->_M_dataplus)._M_p;
          local_78 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)local_68;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,pcVar5,pcVar5 + args->_M_string_length);
          tinyformat::format<std::__cxx11::string>
                    ((string *)&local_58,
                     (tinyformat *)
                     "Key path value \'%s\' specifies multipath in a section where multipath is not allowed"
                     ,(char *)&local_78,args);
          _GLOBAL__N_1::ParseKeyPath();
          goto LAB_00165df1;
        }
        if (bVar7) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(error,0,error->_M_string_length,"Multiple multipath key path specifiers found",
                     0x2c);
          goto LAB_00165df1;
        }
        local_70 = (args->_M_dataplus)._M_p;
        local_78 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(local_70 + 1);
        local_70 = local_70 + ~(ulong)local_78 + args->_M_string_length;
        separators._M_str = pcVar5;
        separators._M_len = (size_t)";";
        util::Split<Span<char_const>>
                  ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)&local_58,
                   (util *)&local_78,(Span<const_char> *)0x1,separators);
        _Var2 = local_50;
        _Var8 = _local_58;
        if ((ulong)((long)local_50 - (long)_local_58) < 0x11) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(error,0,error->_M_string_length,
                     "Multipath key path specifiers must have at least two items",0x3a);
LAB_00165dd4:
          if (_local_58 != (_Optional_payload_base<unsigned_int>)0x0) {
            operator_delete((void *)_local_58,local_48 - (long)_local_58);
          }
          goto LAB_00165df1;
        }
        for (; _Var8 != _Var2; _Var8 = (_Optional_payload_base<unsigned_int>)((long)_Var8 + 0x10)) {
          _local_a0 = (_Optional_payload_base<unsigned_int>)
                      ParseKeyPathNum(*(Span<const_char> *)_Var8,apostrophe,error);
          if (bStack_9c == false) goto LAB_00165dd4;
          local_78 = &local_110;
          pVar11 = std::
                   _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   ::
                   _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                             ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                               *)local_78,&local_a0,&local_78);
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            tinyformat::format<unsigned_int>
                      (&local_98,"Duplicated key path value %u in multipath specifier",
                       &local_a0._M_value);
            _GLOBAL__N_1::ParseKeyPath();
          }
          else if (iStack_d0._M_current == local_c8) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,iStack_d0,
                       &local_a0._M_value);
          }
          else {
            *iStack_d0._M_current = (uint)local_a0;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_00165dd4;
        }
        if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<>
                    (&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = 0;
          local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar4 = (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (_local_58 != (_Optional_payload_base<unsigned_int>)0x0) {
          operator_delete((void *)_local_58,local_48 - (long)_local_58);
        }
        unaff_RBP = (lVar4 >> 2) + -1;
        bVar7 = true;
      }
      uVar6 = uVar6 + 1;
      pSVar3 = (split->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar10 = uVar6 < (ulong)((long)(split->
                                     super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 4
                              );
      bVar9 = !bVar10;
    } while (bVar10);
  }
  if (bVar7) {
    if (iStack_d0._M_current != local_d8) {
      uVar6 = 0;
      do {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_b8);
        *(uint *)((long)_local_58 + unaff_RBP * 4) = local_d8[uVar6];
        std::
        vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
        ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    *)out,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
        if (_local_58 != (_Optional_payload_base<unsigned_int>)0x0) {
          operator_delete((void *)_local_58,local_48 - (long)_local_58);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)iStack_d0._M_current - (long)local_d8 >> 2));
    }
  }
  else {
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)out,&local_b8);
  }
LAB_00165df1:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_110);
  if (local_d8 != (uint *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(__node_base_ptr *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

[[nodiscard]] bool ParseKeyPath(const std::vector<Span<const char>>& split, std::vector<KeyPath>& out, bool& apostrophe, std::string& error, bool allow_multipath)
{
    KeyPath path;
    std::optional<size_t> multipath_segment_index;
    std::vector<uint32_t> multipath_values;
    std::unordered_set<uint32_t> seen_multipath;

    for (size_t i = 1; i < split.size(); ++i) {
        const Span<const char>& elem = split[i];

        // Check if element contain multipath specifier
        if (!elem.empty() && elem.front() == '<' && elem.back() == '>') {
            if (!allow_multipath) {
                error = strprintf("Key path value '%s' specifies multipath in a section where multipath is not allowed", std::string(elem.begin(), elem.end()));
                return false;
            }
            if (multipath_segment_index) {
                error = "Multiple multipath key path specifiers found";
                return false;
            }

            // Parse each possible value
            std::vector<Span<const char>> nums = Split(Span(elem.begin()+1, elem.end()-1), ";");
            if (nums.size() < 2) {
                error = "Multipath key path specifiers must have at least two items";
                return false;
            }

            for (const auto& num : nums) {
                const auto& op_num = ParseKeyPathNum(num, apostrophe, error);
                if (!op_num) return false;
                auto [_, inserted] = seen_multipath.insert(*op_num);
                if (!inserted) {
                    error = strprintf("Duplicated key path value %u in multipath specifier", *op_num);
                    return false;
                }
                multipath_values.emplace_back(*op_num);
            }

            path.emplace_back(); // Placeholder for multipath segment
            multipath_segment_index = path.size()-1;
        } else {
            const auto& op_num = ParseKeyPathNum(elem, apostrophe, error);
            if (!op_num) return false;
            path.emplace_back(*op_num);
        }
    }

    if (!multipath_segment_index) {
        out.emplace_back(std::move(path));
    } else {
        // Replace the multipath placeholder with each value while generating paths
        for (size_t i = 0; i < multipath_values.size(); i++) {
            KeyPath branch_path = path;
            branch_path[*multipath_segment_index] = multipath_values[i];
            out.emplace_back(std::move(branch_path));
        }
    }
    return true;
}